

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationRootElements::findPrimary(CollationRootElements *this,uint32_t p)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  uint32_t uVar7;
  
  puVar1 = this->elements;
  uVar2 = puVar1[2];
  uVar4 = this->length - 1;
  do {
    uVar3 = uVar2;
    if ((int)uVar4 <= (int)(uVar3 + 1)) {
      return uVar3;
    }
    uVar5 = (int)(uVar4 + uVar3) / 2;
    uVar6 = (ulong)uVar5;
    uVar7 = puVar1[(int)uVar5];
    if ((char)uVar7 < '\0') {
      if (uVar5 + 1 != uVar4) {
        uVar6 = (long)(int)uVar5 + 1;
        do {
          uVar7 = puVar1[uVar6];
          if (-1 < (char)uVar7) {
            uVar6 = uVar6 & 0xffffffff;
            goto LAB_0024527b;
          }
          uVar6 = uVar6 + 1;
        } while (uVar4 != (uint32_t)uVar6);
      }
      if (uVar5 - 1 == uVar3) {
        return uVar3;
      }
      uVar6 = (ulong)(int)(uVar5 - 1);
      while (uVar7 = puVar1[uVar6], (char)uVar7 < '\0') {
        uVar6 = uVar6 - 1;
        if (uVar3 == (uint32_t)uVar6) {
          return uVar3;
        }
      }
    }
LAB_0024527b:
    uVar2 = (uint32_t)uVar6;
    if (p < (uVar7 & 0xffffff00)) {
      uVar2 = uVar3;
      uVar4 = (uint32_t)uVar6;
    }
  } while( true );
}

Assistant:

int32_t
CollationRootElements::findPrimary(uint32_t p) const {
    // Requirement: p must occur as a root primary.
    U_ASSERT((p & 0xff) == 0);  // at most a 3-byte primary
    int32_t index = findP(p);
    // If p is in a range, then we just assume that p is an actual primary in this range.
    // (Too cumbersome/expensive to check.)
    // Otherwise, it must be an exact match.
    U_ASSERT(isEndOfPrimaryRange(elements[index + 1]) || p == (elements[index] & 0xffffff00));
    return index;
}